

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMan.c
# Opt level: O1

void Abc_NodeCovDropData(Cov_Man_t *p,Abc_Obj_t *pObj)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  long lVar3;
  void *__ptr;
  Min_Man_t *pMVar4;
  char *pcVar5;
  long lVar6;
  char *pcVar7;
  int iVar8;
  char *pEntry;
  
  pVVar2 = p->vFanCounts;
  if (pVVar2 == (Vec_Int_t *)0x0) {
    __assert_fail("p->vFanCounts",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/cov/covMan.c"
                  ,0x81,"void Abc_NodeCovDropData(Cov_Man_t *, Abc_Obj_t *)");
  }
  iVar1 = pObj->Id;
  lVar6 = (long)iVar1;
  if ((lVar6 < 0) || (pVVar2->nSize <= iVar1)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  if (pVVar2->pArray[lVar6] < 1) {
    __assert_fail("nFanouts > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/cov/covMan.c"
                  ,0x83,"void Abc_NodeCovDropData(Cov_Man_t *, Abc_Obj_t *)");
  }
  iVar8 = pVVar2->pArray[lVar6] + -1;
  if (iVar8 == 0) {
    lVar3 = *(long *)((long)pObj->pNtk->pManCut + 0x18);
    if (iVar1 < *(int *)(lVar3 + 4)) {
      __ptr = *(void **)(*(long *)(*(long *)(lVar3 + 8) + lVar6 * 8) + 0x18);
      if (*(void **)((long)__ptr + 8) != (void *)0x0) {
        free(*(void **)((long)__ptr + 8));
        *(undefined8 *)((long)__ptr + 8) = 0;
      }
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      lVar6 = (long)pObj->Id;
      if ((-1 < lVar6) &&
         (lVar3 = *(long *)((long)pObj->pNtk->pManCut + 0x18), pObj->Id < *(int *)(lVar3 + 4))) {
        lVar3 = *(long *)(lVar3 + 8);
        *(undefined8 *)(*(long *)(lVar3 + lVar6 * 8) + 0x18) = 0;
        pEntry = *(char **)(*(long *)(lVar3 + lVar6 * 8) + 0x10);
        if (pEntry != (char *)0x0) {
          pMVar4 = p->pManMin;
          pcVar5 = *(char **)pEntry;
          while (pcVar7 = pcVar5, Extra_MmFixedEntryRecycle(pMVar4->pMemMan,pEntry),
                pcVar7 != (char *)0x0) {
            pEntry = pcVar7;
            pcVar5 = *(char **)pcVar7;
          }
        }
        iVar1 = pObj->Id;
        if ((-1 < (long)iVar1) &&
           (lVar6 = *(long *)((long)pObj->pNtk->pManCut + 0x18), iVar1 < *(int *)(lVar6 + 4))) {
          *(undefined8 *)(*(long *)(*(long *)(lVar6 + 8) + (long)iVar1 * 8) + 0x10) = 0;
          p->nSupps = p->nSupps + -1;
          goto LAB_00450506;
        }
      }
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
LAB_00450506:
  iVar1 = pObj->Id;
  if ((-1 < (long)iVar1) && (iVar1 < p->vFanCounts->nSize)) {
    p->vFanCounts->pArray[iVar1] = iVar8;
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

void Abc_NodeCovDropData( Cov_Man_t * p, Abc_Obj_t * pObj )
{
    int nFanouts;
    assert( p->vFanCounts );
    nFanouts = Vec_IntEntry( p->vFanCounts, pObj->Id );
    assert( nFanouts > 0 );
    if ( --nFanouts == 0 )
    {
        Vec_IntFree( Abc_ObjGetSupp(pObj) );
        Abc_ObjSetSupp( pObj, NULL );
        Min_CoverRecycle( p->pManMin, Abc_ObjGetCover2(pObj) );
        Abc_ObjSetCover2( pObj, NULL );
        p->nSupps--;
    }
    Vec_IntWriteEntry( p->vFanCounts, pObj->Id, nFanouts );
}